

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSHcode Curl_share_lock(Curl_easy *data,curl_lock_data type,curl_lock_access accesstype)

{
  Curl_share *pCVar1;
  Curl_share *share;
  curl_lock_access accesstype_local;
  curl_lock_data type_local;
  Curl_easy *data_local;
  
  pCVar1 = data->share;
  if (pCVar1 == (Curl_share *)0x0) {
    data_local._4_4_ = CURLSHE_INVALID;
  }
  else {
    if (((pCVar1->specifier & 1 << ((byte)type & 0x1f)) != 0) &&
       (pCVar1->lockfunc != (curl_lock_function)0x0)) {
      (*pCVar1->lockfunc)(data,type,accesstype,pCVar1->clientdata);
    }
    data_local._4_4_ = CURLSHE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLSHcode
Curl_share_lock(struct Curl_easy *data, curl_lock_data type,
                curl_lock_access accesstype)
{
  struct Curl_share *share = data->share;

  if(!share)
    return CURLSHE_INVALID;

  if(share->specifier & (1<<type)) {
    if(share->lockfunc) /* only call this if set! */
      share->lockfunc(data, type, accesstype, share->clientdata);
  }
  /* else if we don't share this, pretend successful lock */

  return CURLSHE_OK;
}